

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool do_perm_pred2(DisasContext_conflict1 *s,arg_rr_esz *a,_Bool high_odd,
                   gen_helper_gvec_2_conflict1 *fn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_ptr pTVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  TCGv_ptr r;
  TCGv_ptr r_00;
  TCGv_i32 arg;
  int desc;
  TCGv_i32 t_desc;
  TCGv_ptr t_n;
  TCGv_ptr t_d;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  gen_helper_gvec_2_conflict1 *fn_local;
  _Bool high_odd_local;
  arg_rr_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var2 = sve_access_check_aarch64(s);
  if (_Var2) {
    iVar3 = pred_full_reg_size(s);
    r = tcg_temp_new_ptr(tcg_ctx_00);
    r_00 = tcg_temp_new_ptr(tcg_ctx_00);
    pTVar1 = tcg_ctx_00->cpu_env;
    iVar4 = pred_full_reg_offset(s,a->rd);
    tcg_gen_addi_ptr(tcg_ctx_00,r,pTVar1,(long)iVar4);
    pTVar1 = tcg_ctx_00->cpu_env;
    iVar4 = pred_full_reg_offset(s,a->rn);
    tcg_gen_addi_ptr(tcg_ctx_00,r_00,pTVar1,(long)iVar4);
    uVar5 = deposit32(iVar3 - 2,10,2,a->esz);
    uVar5 = deposit32(uVar5,0xc,2,(uint)high_odd);
    arg = tcg_const_i32_aarch64(tcg_ctx_00,uVar5);
    (*fn)(tcg_ctx_00,r,r_00,arg);
    tcg_temp_free_i32(tcg_ctx_00,arg);
    tcg_temp_free_ptr(tcg_ctx_00,r);
    tcg_temp_free_ptr(tcg_ctx_00,r_00);
  }
  return true;
}

Assistant:

static bool do_perm_pred2(DisasContext *s, arg_rr_esz *a, bool high_odd,
                          gen_helper_gvec_2 *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!sve_access_check(s)) {
        return true;
    }

    unsigned vsz = pred_full_reg_size(s);
    TCGv_ptr t_d = tcg_temp_new_ptr(tcg_ctx);
    TCGv_ptr t_n = tcg_temp_new_ptr(tcg_ctx);
    TCGv_i32 t_desc;
    int desc;

    tcg_gen_addi_ptr(tcg_ctx, t_d, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->rd));
    tcg_gen_addi_ptr(tcg_ctx, t_n, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->rn));

    /* Predicate sizes may be smaller and cannot use simd_desc.
       We cannot round up, as we do elsewhere, because we need
       the exact size for ZIP2 and REV.  We retain the style for
       the other helpers for consistency.  */

    desc = vsz - 2;
    desc = deposit32(desc, SIMD_DATA_SHIFT, 2, a->esz);
    desc = deposit32(desc, SIMD_DATA_SHIFT + 2, 2, high_odd);
    t_desc = tcg_const_i32(tcg_ctx, desc);

    fn(tcg_ctx, t_d, t_n, t_desc);

    tcg_temp_free_i32(tcg_ctx, t_desc);
    tcg_temp_free_ptr(tcg_ctx, t_d);
    tcg_temp_free_ptr(tcg_ctx, t_n);
    return true;
}